

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O1

void gutil::runParallel(ParallelFunction *fct,long start,long end,long step)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  Thread *this;
  long lVar6;
  Thread *pTVar7;
  
  uVar1 = gutil::Thread::getMaxThreads();
  uVar3 = ((end - start) + step) / step;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar1 < (int)uVar3) {
    uVar4 = (ulong)uVar1;
  }
  iVar2 = (int)uVar4;
  if (iVar2 < 2) {
    (**fct->_vptr_ParallelFunction)(fct,start,end,step);
    return;
  }
  puVar5 = (ulong *)operator_new__(uVar4 * 8 + 8);
  *puVar5 = uVar4;
  pTVar7 = (Thread *)(puVar5 + 1);
  lVar6 = 0;
  this = pTVar7;
  do {
    gutil::Thread::Thread(this);
    lVar6 = lVar6 + -8;
    this = this + 8;
  } while (-lVar6 != uVar4 * 8);
  uVar3 = uVar4;
  do {
    gutil::Thread::create((ParallelFunction *)pTVar7,(long)fct,start,end,iVar2 * (int)step);
    start = start + step;
    pTVar7 = pTVar7 + 8;
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  uVar3 = 1;
  if (1 < iVar2) {
    uVar3 = uVar4;
  }
  do {
    gutil::Thread::join();
    uVar3 = uVar3 - 1;
  } while (uVar3 != 0);
  if (*puVar5 != 0) {
    lVar6 = *puVar5 << 3;
    do {
      gutil::Thread::~Thread((Thread *)((long)puVar5 + lVar6));
      lVar6 = lVar6 + -8;
    } while (lVar6 != 0);
  }
  operator_delete__(puVar5);
  return;
}

Assistant:

inline void runParallel(ParallelFunction &fct, long start, long end, long step)
{
  int n=Thread::getMaxThreads();
  n=std::min(n, static_cast<int>((end-start+1+step-1)/step));

  if (n > 1)
  {
    Thread *thread=new Thread [n];

    for (int i=0; i<n; i++)
    {
      thread[i].create(fct, start+i*step, end, n*step, -1);
    }

    for (int i=0; i<n; i++)
    {
      thread[i].join();
    }

    delete [] thread;
  }
  else
  {
    fct.run(start, end, step);
  }
}